

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lfunc.c
# Opt level: O0

void luaF_initupvals(lua_State *L,LClosure *cl)

{
  UpVal *v;
  UpVal *uv;
  GCObject *o;
  int i;
  LClosure *cl_local;
  lua_State *L_local;
  
  for (o._4_4_ = 0; o._4_4_ < (int)(uint)cl->nupvalues; o._4_4_ = o._4_4_ + 1) {
    v = (UpVal *)luaC_newobj(L,'\t',0x28);
    (v->v).p = (TValue *)&v->u;
    ((v->v).p)->tt_ = '\0';
    cl->upvals[o._4_4_] = v;
    if (((cl->marked & 0x20) != 0) && ((v->marked & 0x18) != 0)) {
      luaC_barrier_(L,(GCObject *)cl,(GCObject *)v);
    }
  }
  return;
}

Assistant:

void luaF_initupvals (lua_State *L, LClosure *cl) {
  int i;
  for (i = 0; i < cl->nupvalues; i++) {
    GCObject *o = luaC_newobj(L, LUA_VUPVAL, sizeof(UpVal));
    UpVal *uv = gco2upv(o);
    uv->v.p = &uv->u.value;  /* make it closed */
    setnilvalue(uv->v.p);
    cl->upvals[i] = uv;
    luaC_objbarrier(L, cl, uv);
  }
}